

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_copy.cpp
# Opt level: O3

void duckdb::VectorOperations::Copy
               (Vector *source_p,Vector *target,SelectionVector *sel_p,idx_t source_count,
               idx_t source_offset,idx_t target_offset,idx_t copy_count)

{
  VectorType VVar1;
  VectorType VVar2;
  PhysicalType PVar3;
  int64_t *piVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  sel_t *psVar5;
  long lVar6;
  byte bVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [8];
  char *ldata;
  VectorBuffer *pVVar12;
  VectorBuffer *pVVar13;
  SelectionVector *sel;
  ValidityMask *this_00;
  TemplatedValidityData<unsigned_long> *pTVar14;
  _Head_base<0UL,_unsigned_long_*,_false> _Var15;
  Vector *pVVar16;
  Vector *target_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_02;
  const_reference this_03;
  type source_p_00;
  reference this_04;
  type target_01;
  NotImplementedException *pNVar17;
  InternalException *this_05;
  unsigned_long *puVar18;
  PhysicalType type;
  pointer pcVar19;
  long *plVar20;
  byte bVar21;
  data_ptr_t pdVar22;
  idx_t count;
  idx_t iVar23;
  idx_t source_offset_00;
  int iVar24;
  ulong uVar25;
  long lVar26;
  idx_t i;
  idx_t iVar27;
  idx_t idx_in_entry;
  data_ptr_t pdVar28;
  size_type __n;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  string_t sVar34;
  buffer_ptr<SelectionData> new_buffer;
  SelectionVector child_sel_1;
  SelectionVector owned_sel;
  ulong local_160;
  data_ptr_t local_158;
  idx_t local_130;
  undefined1 local_118 [8];
  LogicalType aLStack_110 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  SelectionVector local_b0;
  buffer_ptr<SelectionData> local_98;
  undefined1 local_88 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  LogicalType local_68;
  string local_50;
  long lVar32;
  
  local_130 = copy_count;
  local_88 = (undefined1  [16])0x0;
  local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sel = sel_p;
  while( true ) {
    VVar1 = source_p->vector_type;
    if (VVar1 != DICTIONARY_VECTOR) break;
    DictionaryVector::VerifyDictionary(source_p);
    pVVar12 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&source_p->auxiliary);
    DictionaryVector::VerifyDictionary(source_p);
    pVVar13 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&source_p->buffer);
    SelectionVector::Slice((SelectionVector *)local_118,(SelectionVector *)(pVVar13 + 1),(idx_t)sel)
    ;
    local_98.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_118;
    local_98.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_110[0]._0_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_110[0]._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(aLStack_110[0]._0_8_ + 8) =
             *(_Atomic_word *)(aLStack_110[0]._0_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(aLStack_110[0]._0_8_ + 8) =
             *(_Atomic_word *)(aLStack_110[0]._0_8_ + 8) + 1;
      }
    }
    SelectionVector::Initialize((SelectionVector *)local_88,&local_98);
    if (local_98.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_110[0]._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_110[0]._0_8_);
    }
    source_p = (Vector *)(pVVar12 + 1);
    sel = (SelectionVector *)local_88;
  }
  if (FSST_VECTOR < VVar1) {
    if (VVar1 != CONSTANT_VECTOR) {
      if (VVar1 != SEQUENCE_VECTOR) {
        pNVar17 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_118 = (undefined1  [8])&aLStack_110[0].type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"FIXME unimplemented vector type for VectorOperations::Copy",
                   "");
        NotImplementedException::NotImplementedException(pNVar17,(string *)local_118);
        __cxa_throw(pNVar17,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      LogicalType::LogicalType(&local_68,&source_p->type);
      Vector::Vector((Vector *)local_118,&local_68,0x800);
      LogicalType::~LogicalType(&local_68);
      pVVar12 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&source_p->buffer);
      piVar4 = (int64_t *)(pVVar12->data).pointer;
      GenerateSequence((Vector *)local_118,source_count,sel,*piVar4,piVar4[1]);
      Copy((Vector *)local_118,target,sel,source_count,source_offset,target_offset,
           source_count - source_offset);
      if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
      }
      if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
      }
      if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_118 + 8));
      goto LAB_01382217;
    }
    sel = ConstantVector::ZeroSelectionVector(copy_count,(SelectionVector *)local_88);
  }
  if (copy_count == 0) goto LAB_01382217;
  VVar1 = target->vector_type;
  local_158 = (data_ptr_t)target_offset;
  if (VVar1 == CONSTANT_VECTOR && copy_count == 1) {
    local_158 = (data_ptr_t)0x0;
    Vector::SetVectorType(target,FLAT_VECTOR);
  }
  FlatVector::VerifyFlatVector(target);
  this_00 = &target->validity;
  VVar2 = source_p->vector_type;
  if (VVar2 == FLAT_VECTOR) {
    FlatVector::VerifyFlatVector(source_p);
LAB_01381781:
    ValidityMask::CopySel(this_00,&source_p->validity,sel,source_offset,(idx_t)local_158,copy_count)
    ;
  }
  else {
    if (VVar2 == FSST_VECTOR) goto LAB_01381781;
    if (VVar2 != CONSTANT_VECTOR) {
      this_05 = (InternalException *)__cxa_allocate_exception(0x10);
      local_118 = (undefined1  [8])&aLStack_110[0].type_info_;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"Unsupported vector type in vector copy","");
      InternalException::InternalException(this_05,(string *)local_118);
      __cxa_throw(this_05,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    puVar18 = (source_p->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar18 == (unsigned_long *)0x0) {
      bVar21 = 1;
    }
    else {
      bVar21 = (byte)*puVar18 & 1;
    }
    _Var15._M_head_impl =
         (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar27 = copy_count;
    pdVar28 = local_158;
    do {
      if (bVar21 == 0) {
        if (_Var15._M_head_impl == (unsigned_long *)0x0) {
          local_b0.sel_vector =
               (sel_t *)(target->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_118,(unsigned_long *)&local_b0);
          auVar11 = local_118;
          uVar8 = aLStack_110[0]._0_8_;
          _local_118 = (undefined1  [16])0x0;
          this = (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)auVar11;
          (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_110[0]._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_110[0]._0_8_);
            }
          }
          pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(target->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var15._M_head_impl =
               (pTVar14->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var15._M_head_impl;
        }
        bVar7 = (byte)pdVar28 & 0x3f;
        _Var15._M_head_impl[(ulong)pdVar28 >> 6] =
             _Var15._M_head_impl[(ulong)pdVar28 >> 6] &
             (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      }
      else if (_Var15._M_head_impl == (unsigned_long *)0x0) {
        _Var15._M_head_impl = (unsigned_long *)0x0;
      }
      else {
        _Var15._M_head_impl[(ulong)pdVar28 >> 6] =
             _Var15._M_head_impl[(ulong)pdVar28 >> 6] | 1L << ((byte)pdVar28 & 0x3f);
      }
      pdVar28 = (data_ptr_t)((long)pdVar28 + 1);
      iVar27 = iVar27 - 1;
    } while (iVar27 != 0);
  }
  if (source_p->vector_type == FSST_VECTOR) {
    FSSTVector::DecompressVector(source_p,target,source_offset,(idx_t)local_158,copy_count,sel);
    goto LAB_01382217;
  }
  PVar3 = (source_p->type).physical_type_;
  local_160 = source_offset;
  if (199 < PVar3) {
    if (PVar3 == VARCHAR) {
      pdVar28 = source_p->data;
      pdVar22 = target->data + (long)local_158 * 0x10 + 8;
      do {
        uVar25 = local_160;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar25 = (ulong)sel->sel_vector[local_160];
        }
        puVar18 = (this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar18 == (unsigned_long *)0x0) ||
           (puVar18 = (unsigned_long *)puVar18[(ulong)local_158 >> 6],
           ((ulong)puVar18 >> ((ulong)local_158 & 0x3f) & 1) != 0)) {
          sVar34.value.pointer.ptr = (char *)puVar18;
          sVar34.value._0_8_ = *(undefined8 *)(pdVar28 + uVar25 * 0x10 + 8);
          sVar34 = StringVector::AddStringOrBlob
                             ((StringVector *)target,*(Vector **)(pdVar28 + uVar25 * 0x10),sVar34);
          *(long *)(pdVar22 + -8) = sVar34.value._0_8_;
          *(long *)pdVar22 = sVar34.value._8_8_;
        }
        local_158 = (data_ptr_t)((long)local_158 + 1);
        pdVar22 = pdVar22 + 0x10;
        local_160 = local_160 + 1;
        local_130 = local_130 - 1;
      } while (local_130 != 0);
    }
    else if (PVar3 == UINT128) {
      pdVar28 = source_p->data;
      pdVar22 = target->data + (long)local_158 * 0x10;
      do {
        uVar25 = local_160;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar25 = (ulong)sel->sel_vector[local_160];
        }
        uVar8 = *(undefined8 *)(pdVar28 + uVar25 * 0x10 + 8);
        *(undefined8 *)pdVar22 = *(undefined8 *)(pdVar28 + uVar25 * 0x10);
        *(undefined8 *)(pdVar22 + 8) = uVar8;
        pdVar22 = pdVar22 + 0x10;
        local_160 = local_160 + 1;
        local_130 = local_130 - 1;
      } while (local_130 != 0);
    }
    else {
      if (PVar3 != INT128) goto switchD_013818e1_caseD_a;
      pdVar28 = source_p->data;
      pdVar22 = target->data + (long)local_158 * 0x10;
      do {
        uVar25 = local_160;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar25 = (ulong)sel->sel_vector[local_160];
        }
        uVar8 = *(undefined8 *)(pdVar28 + uVar25 * 0x10 + 8);
        *(undefined8 *)pdVar22 = *(undefined8 *)(pdVar28 + uVar25 * 0x10);
        *(undefined8 *)(pdVar22 + 8) = uVar8;
        pdVar22 = pdVar22 + 0x10;
        local_160 = local_160 + 1;
        local_130 = local_130 - 1;
      } while (local_130 != 0);
    }
    goto LAB_01382204;
  }
  switch(PVar3) {
  case BOOL:
  case INT8:
    pdVar28 = source_p->data;
    local_158 = target->data + (long)local_158;
    do {
      uVar25 = local_160;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar25 = (ulong)sel->sel_vector[local_160];
      }
      *local_158 = pdVar28[uVar25];
      local_158 = local_158 + 1;
      local_160 = local_160 + 1;
      local_130 = local_130 - 1;
    } while (local_130 != 0);
    break;
  case UINT8:
    pdVar28 = source_p->data;
    local_158 = target->data + (long)local_158;
    do {
      uVar25 = local_160;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar25 = (ulong)sel->sel_vector[local_160];
      }
      *local_158 = pdVar28[uVar25];
      local_158 = local_158 + 1;
      local_160 = local_160 + 1;
      local_130 = local_130 - 1;
    } while (local_130 != 0);
    break;
  case UINT16:
    pdVar28 = source_p->data;
    psVar5 = sel->sel_vector;
    pdVar22 = target->data;
    iVar27 = 0;
    do {
      if (psVar5 == (sel_t *)0x0) {
        uVar25 = source_offset + iVar27;
      }
      else {
        uVar25 = (ulong)psVar5[source_offset + iVar27];
      }
      *(undefined2 *)(pdVar22 + iVar27 * 2 + (long)local_158 * 2) =
           *(undefined2 *)(pdVar28 + uVar25 * 2);
      iVar27 = iVar27 + 1;
    } while (copy_count != iVar27);
    break;
  case INT16:
    pdVar28 = source_p->data;
    psVar5 = sel->sel_vector;
    pdVar22 = target->data;
    iVar27 = 0;
    do {
      if (psVar5 == (sel_t *)0x0) {
        uVar25 = source_offset + iVar27;
      }
      else {
        uVar25 = (ulong)psVar5[source_offset + iVar27];
      }
      *(undefined2 *)(pdVar22 + iVar27 * 2 + (long)local_158 * 2) =
           *(undefined2 *)(pdVar28 + uVar25 * 2);
      iVar27 = iVar27 + 1;
    } while (copy_count != iVar27);
    break;
  case UINT32:
    pdVar28 = source_p->data;
    psVar5 = sel->sel_vector;
    pdVar22 = target->data;
    iVar27 = 0;
    do {
      if (psVar5 == (sel_t *)0x0) {
        uVar25 = source_offset + iVar27;
      }
      else {
        uVar25 = (ulong)psVar5[source_offset + iVar27];
      }
      *(undefined4 *)(pdVar22 + iVar27 * 4 + (long)local_158 * 4) =
           *(undefined4 *)(pdVar28 + uVar25 * 4);
      iVar27 = iVar27 + 1;
    } while (copy_count != iVar27);
    break;
  case INT32:
    pdVar28 = source_p->data;
    psVar5 = sel->sel_vector;
    pdVar22 = target->data;
    iVar27 = 0;
    do {
      if (psVar5 == (sel_t *)0x0) {
        uVar25 = source_offset + iVar27;
      }
      else {
        uVar25 = (ulong)psVar5[source_offset + iVar27];
      }
      *(undefined4 *)(pdVar22 + iVar27 * 4 + (long)local_158 * 4) =
           *(undefined4 *)(pdVar28 + uVar25 * 4);
      iVar27 = iVar27 + 1;
    } while (copy_count != iVar27);
    break;
  case UINT64:
    pdVar28 = source_p->data;
    psVar5 = sel->sel_vector;
    pdVar22 = target->data;
    iVar27 = 0;
    do {
      if (psVar5 == (sel_t *)0x0) {
        uVar25 = source_offset + iVar27;
      }
      else {
        uVar25 = (ulong)psVar5[source_offset + iVar27];
      }
      *(undefined8 *)(pdVar22 + iVar27 * 8 + (long)local_158 * 8) =
           *(undefined8 *)(pdVar28 + uVar25 * 8);
      iVar27 = iVar27 + 1;
    } while (copy_count != iVar27);
    break;
  case INT64:
    pdVar28 = source_p->data;
    psVar5 = sel->sel_vector;
    pdVar22 = target->data;
    iVar27 = 0;
    do {
      if (psVar5 == (sel_t *)0x0) {
        uVar25 = source_offset + iVar27;
      }
      else {
        uVar25 = (ulong)psVar5[source_offset + iVar27];
      }
      *(undefined8 *)(pdVar22 + iVar27 * 8 + (long)local_158 * 8) =
           *(undefined8 *)(pdVar28 + uVar25 * 8);
      iVar27 = iVar27 + 1;
    } while (copy_count != iVar27);
    break;
  default:
switchD_013818e1_caseD_a:
    pNVar17 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_118 = (undefined1  [8])&aLStack_110[0].type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,"Unimplemented type \'%s\' for copy!","");
    TypeIdToString_abi_cxx11_(&local_50,(duckdb *)(ulong)(source_p->type).physical_type_,type);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (pNVar17,(string *)local_118,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
    __cxa_throw(pNVar17,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    pdVar28 = source_p->data;
    psVar5 = sel->sel_vector;
    pdVar22 = target->data;
    iVar27 = 0;
    do {
      if (psVar5 == (sel_t *)0x0) {
        uVar25 = source_offset + iVar27;
      }
      else {
        uVar25 = (ulong)psVar5[source_offset + iVar27];
      }
      *(undefined4 *)(pdVar22 + iVar27 * 4 + (long)local_158 * 4) =
           *(undefined4 *)(pdVar28 + uVar25 * 4);
      iVar27 = iVar27 + 1;
    } while (copy_count != iVar27);
    break;
  case DOUBLE:
    pdVar28 = source_p->data;
    psVar5 = sel->sel_vector;
    pdVar22 = target->data;
    iVar27 = 0;
    do {
      if (psVar5 == (sel_t *)0x0) {
        uVar25 = source_offset + iVar27;
      }
      else {
        uVar25 = (ulong)psVar5[source_offset + iVar27];
      }
      *(undefined8 *)(pdVar22 + iVar27 * 8 + (long)local_158 * 8) =
           *(undefined8 *)(pdVar28 + uVar25 * 8);
      iVar27 = iVar27 + 1;
    } while (copy_count != iVar27);
    break;
  case INTERVAL:
    pdVar28 = source_p->data;
    pdVar22 = target->data + (long)local_158 * 0x10;
    do {
      uVar25 = local_160;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar25 = (ulong)sel->sel_vector[local_160];
      }
      uVar8 = *(undefined8 *)(pdVar28 + uVar25 * 0x10 + 8);
      *(undefined8 *)pdVar22 = *(undefined8 *)(pdVar28 + uVar25 * 0x10);
      *(undefined8 *)(pdVar22 + 8) = uVar8;
      pdVar22 = pdVar22 + 0x10;
      local_160 = local_160 + 1;
      local_130 = local_130 - 1;
    } while (local_130 != 0);
    break;
  case LIST:
    pVVar16 = ListVector::GetEntry(source_p);
    pdVar22 = source_p->data;
    pdVar28 = target->data;
    if (VVar1 != CONSTANT_VECTOR) {
      _local_118 = (undefined1  [16])0x0;
      aLStack_110[0].type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      iVar27 = 0;
      do {
        puVar18 = (this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar18 == (unsigned_long *)0x0) ||
           ((puVar18[(long)local_158 + iVar27 >> 6] >> ((long)local_158 + iVar27 & 0x3f) & 1) != 0))
        {
          uVar25 = source_offset + iVar27;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar25 = (ulong)sel->sel_vector[uVar25];
          }
          if (*(long *)(pdVar22 + uVar25 * 0x10 + 8) != 0) {
            uVar29 = 0;
            do {
              lVar32 = *(long *)(pdVar22 + uVar25 * 0x10);
              local_b0.sel_vector = (sel_t *)(uVar29 + lVar32);
              if ((element_type *)aLStack_110[0]._0_8_ ==
                  aLStack_110[0].type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
                ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_long>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
                           (iterator)aLStack_110[0]._0_8_,(unsigned_long *)&local_b0);
              }
              else {
                *(int *)aLStack_110[0]._0_8_ = (int)lVar32 + (int)uVar29;
                aLStack_110[0]._0_8_ = (uint *)(aLStack_110[0]._0_8_ + 4);
              }
              uVar29 = uVar29 + 1;
            } while (uVar29 < *(ulong *)((long)(pdVar22 + uVar25 * 0x10) + 8));
          }
        }
        iVar27 = iVar27 + 1;
      } while (iVar27 != copy_count);
      auVar11 = local_118;
      uVar8 = aLStack_110[0]._0_8_;
      local_b0.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
           (original)(__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
      local_b0.sel_vector = (sel_t *)local_118;
      iVar27 = ListVector::GetListSize(target);
      ListVector::Append(target,pVVar16,&local_b0,uVar8 - (long)auVar11 >> 2,0);
      psVar5 = sel->sel_vector;
      puVar18 = (this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      plVar20 = (long *)(pdVar28 + (long)local_158 * 0x10 + 8);
      do {
        uVar25 = source_offset;
        if (psVar5 != (sel_t *)0x0) {
          uVar25 = (ulong)psVar5[source_offset];
        }
        lVar32 = *(long *)(pdVar22 + uVar25 * 0x10 + 8);
        *plVar20 = lVar32;
        plVar20[-1] = iVar27;
        if ((puVar18 == (unsigned_long *)0x0) ||
           ((puVar18[(ulong)local_158 >> 6] >> ((ulong)local_158 & 0x3f) & 1) != 0)) {
          iVar27 = iVar27 + lVar32;
        }
        local_158 = (data_ptr_t)((long)local_158 + 1);
        plVar20 = plVar20 + 2;
        source_offset = source_offset + 1;
        local_130 = local_130 - 1;
      } while (local_130 != 0);
      if (local_b0.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_118 != (undefined1  [8])0x0) {
        operator_delete((void *)local_118);
      }
      break;
    }
    puVar18 = (this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    if ((puVar18 == (unsigned_long *)0x0) ||
       ((puVar18[(ulong)local_158 >> 6] >> ((ulong)local_158 & 0x3f) & 1) != 0)) {
      if (sel->sel_vector != (sel_t *)0x0) {
        source_offset = (idx_t)sel->sel_vector[source_offset];
      }
      lVar26 = source_offset * 0x10;
      lVar32 = *(long *)(pdVar22 + lVar26);
      lVar6 = *(long *)(pdVar22 + lVar26 + 8);
      ListVector::SetListSize(target,0);
      ListVector::Append(target,pVVar16,lVar32 + lVar6,*(idx_t *)(pdVar22 + lVar26));
      *(idx_t *)(pdVar28 + (long)local_158 * 0x10 + 8) = *(idx_t *)((long)(pdVar22 + lVar26) + 8);
      pdVar28 = pdVar28 + (long)local_158 * 0x10;
      pdVar28[0] = '\0';
      pdVar28[1] = '\0';
      pdVar28[2] = '\0';
      pdVar28[3] = '\0';
      pdVar28[4] = '\0';
      pdVar28[5] = '\0';
      pdVar28[6] = '\0';
      pdVar28[7] = '\0';
    }
    goto LAB_01382209;
  case STRUCT:
    this_01 = StructVector::GetEntries(source_p);
    this_02 = StructVector::GetEntries(target);
    if ((this_01->
        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this_01->
        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        this_03 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](this_01,__n);
        source_p_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(this_03);
        this_04 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](this_02,__n);
        target_01 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (this_04);
        Copy(source_p_00,target_01,sel_p,source_count,source_offset,(idx_t)local_158,copy_count);
        __n = __n + 1;
      } while (__n < (ulong)((long)(this_01->
                                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_01->
                                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    break;
  case ARRAY:
    pVVar16 = ArrayVector::GetEntry(source_p);
    target_00 = ArrayVector::GetEntry(target);
    iVar27 = ArrayType::GetSize(&source_p->type);
    count = source_count * iVar27;
    SelectionVector::SelectionVector((SelectionVector *)local_118,count);
    auVar10 = _DAT_01d99b10;
    auVar9 = _DAT_01d99b00;
    psVar5 = sel->sel_vector;
    source_offset_00 = iVar27 * source_offset;
    lVar32 = iVar27 - 1;
    auVar30._8_4_ = (int)lVar32;
    auVar30._0_8_ = lVar32;
    auVar30._12_4_ = (int)((ulong)lVar32 >> 0x20);
    pcVar19 = (pointer)((long)local_118 + source_offset_00 * 4 + 4);
    iVar23 = 0;
    auVar30 = auVar30 ^ _DAT_01d99b10;
    do {
      uVar25 = iVar23 + source_offset;
      if (psVar5 != (sel_t *)0x0) {
        uVar25 = (ulong)psVar5[uVar25];
      }
      if (iVar27 != 0) {
        iVar24 = (int)uVar25 * (int)iVar27;
        uVar25 = 0;
        auVar31 = auVar9;
        do {
          auVar33 = auVar31 ^ auVar10;
          if ((bool)(~(auVar30._4_4_ < auVar33._4_4_ ||
                      auVar30._0_4_ < auVar33._0_4_ && auVar33._4_4_ == auVar30._4_4_) & 1)) {
            *(int *)(pcVar19 + (uVar25 - 1) * 4) = iVar24;
          }
          if (auVar33._12_4_ <= auVar30._12_4_ &&
              (auVar33._8_4_ <= auVar30._8_4_ || auVar33._12_4_ != auVar30._12_4_)) {
            *(int *)(pcVar19 + uVar25 * 4) = iVar24 + 1;
          }
          uVar25 = uVar25 + 2;
          lVar32 = auVar31._8_8_;
          auVar31._0_8_ = auVar31._0_8_ + 2;
          auVar31._8_8_ = lVar32 + 2;
          iVar24 = iVar24 + 2;
        } while ((iVar27 + 1 & 0xfffffffffffffffe) != uVar25);
      }
      iVar23 = iVar23 + 1;
      pcVar19 = pcVar19 + iVar27 * 4;
    } while (iVar23 != copy_count);
    Copy(pVVar16,target_00,(SelectionVector *)local_118,count,source_offset_00,
         iVar27 * (long)local_158,count - source_offset_00);
    if (aLStack_110[0].type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 aLStack_110[0].type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
LAB_01382204:
  if (VVar1 != FLAT_VECTOR) {
LAB_01382209:
    Vector::SetVectorType(target,VVar1);
  }
LAB_01382217:
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
  }
  return;
}

Assistant:

void VectorOperations::Copy(const Vector &source_p, Vector &target, const SelectionVector &sel_p, idx_t source_count,
                            idx_t source_offset, idx_t target_offset, idx_t copy_count) {

	SelectionVector owned_sel;
	const SelectionVector *sel = &sel_p;

	const Vector *source = &source_p;
	bool finished = false;
	while (!finished) {
		switch (source->GetVectorType()) {
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector: merge selection vectors
			auto &child = DictionaryVector::Child(*source);
			auto &dict_sel = DictionaryVector::SelVector(*source);
			// merge the selection vectors and verify the child
			auto new_buffer = dict_sel.Slice(*sel, source_count);
			owned_sel.Initialize(new_buffer);
			sel = &owned_sel;
			source = &child;
			break;
		}
		case VectorType::SEQUENCE_VECTOR: {
			int64_t start, increment;
			Vector seq(source->GetType());
			SequenceVector::GetSequence(*source, start, increment);
			VectorOperations::GenerateSequence(seq, source_count, *sel, start, increment);
			VectorOperations::Copy(seq, target, *sel, source_count, source_offset, target_offset);
			return;
		}
		case VectorType::CONSTANT_VECTOR:
			sel = ConstantVector::ZeroSelectionVector(copy_count, owned_sel);
			finished = true;
			break;
		case VectorType::FSST_VECTOR:
			finished = true;
			break;
		case VectorType::FLAT_VECTOR:
			finished = true;
			break;
		default:
			throw NotImplementedException("FIXME unimplemented vector type for VectorOperations::Copy");
		}
	}

	if (copy_count == 0) {
		return;
	}

	// Allow copying of a single value to constant vectors
	const auto target_vector_type = target.GetVectorType();
	if (copy_count == 1 && target_vector_type == VectorType::CONSTANT_VECTOR) {
		target_offset = 0;
		target.SetVectorType(VectorType::FLAT_VECTOR);
	}
	D_ASSERT(target.GetVectorType() == VectorType::FLAT_VECTOR);

	// first copy the nullmask
	auto &tmask = FlatVector::Validity(target);
	if (source->GetVectorType() == VectorType::CONSTANT_VECTOR) {
		const bool valid = !ConstantVector::IsNull(*source);
		for (idx_t i = 0; i < copy_count; i++) {
			tmask.Set(target_offset + i, valid);
		}
	} else {
		auto &smask = ExtractValidityMask(*source);
		tmask.CopySel(smask, *sel, source_offset, target_offset, copy_count);
	}

	D_ASSERT(sel);

	// For FSST Vectors we decompress instead of copying.
	if (source->GetVectorType() == VectorType::FSST_VECTOR) {
		FSSTVector::DecompressVector(*source, target, source_offset, target_offset, copy_count, sel);
		return;
	}

	// now copy over the data
	switch (source->GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedCopy<int8_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::INT16:
		TemplatedCopy<int16_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::INT32:
		TemplatedCopy<int32_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::INT64:
		TemplatedCopy<int64_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::UINT8:
		TemplatedCopy<uint8_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::UINT16:
		TemplatedCopy<uint16_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::UINT32:
		TemplatedCopy<uint32_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::UINT64:
		TemplatedCopy<uint64_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::INT128:
		TemplatedCopy<hugeint_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::UINT128:
		TemplatedCopy<uhugeint_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::FLOAT:
		TemplatedCopy<float>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::DOUBLE:
		TemplatedCopy<double>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::INTERVAL:
		TemplatedCopy<interval_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::VARCHAR: {
		auto ldata = FlatVector::GetData<string_t>(*source);
		auto tdata = FlatVector::GetData<string_t>(target);
		for (idx_t i = 0; i < copy_count; i++) {
			auto source_idx = sel->get_index(source_offset + i);
			auto target_idx = target_offset + i;
			if (tmask.RowIsValid(target_idx)) {
				tdata[target_idx] = StringVector::AddStringOrBlob(target, ldata[source_idx]);
			}
		}
		break;
	}
	case PhysicalType::STRUCT: {
		auto &source_children = StructVector::GetEntries(*source);
		auto &target_children = StructVector::GetEntries(target);
		D_ASSERT(source_children.size() == target_children.size());
		for (idx_t i = 0; i < source_children.size(); i++) {
			VectorOperations::Copy(*source_children[i], *target_children[i], sel_p, source_count, source_offset,
			                       target_offset, copy_count);
		}
		break;
	}
	case PhysicalType::ARRAY: {
		D_ASSERT(target.GetType().InternalType() == PhysicalType::ARRAY);
		D_ASSERT(ArrayType::GetSize(source->GetType()) == ArrayType::GetSize(target.GetType()));

		auto &source_child = ArrayVector::GetEntry(*source);
		auto &target_child = ArrayVector::GetEntry(target);
		auto array_size = ArrayType::GetSize(source->GetType());

		// Create a selection vector for the child elements
		SelectionVector child_sel(source_count * array_size);
		for (idx_t i = 0; i < copy_count; i++) {
			auto source_idx = sel->get_index(source_offset + i);
			for (idx_t j = 0; j < array_size; j++) {
				child_sel.set_index((source_offset * array_size) + (i * array_size + j), source_idx * array_size + j);
			}
		}
		VectorOperations::Copy(source_child, target_child, child_sel, source_count * array_size,
		                       source_offset * array_size, target_offset * array_size);
		break;
	}
	case PhysicalType::LIST: {
		D_ASSERT(target.GetType().InternalType() == PhysicalType::LIST);

		auto &source_child = ListVector::GetEntry(*source);
		auto sdata = FlatVector::GetData<list_entry_t>(*source);
		auto tdata = FlatVector::GetData<list_entry_t>(target);

		if (target_vector_type == VectorType::CONSTANT_VECTOR) {
			// If we are only writing one value, then the copied values (if any) are contiguous
			// and we can just Append from the offset position
			if (!tmask.RowIsValid(target_offset)) {
				break;
			}
			auto source_idx = sel->get_index(source_offset);
			auto &source_entry = sdata[source_idx];
			const idx_t source_child_size = source_entry.length + source_entry.offset;

			//! overwrite constant target vectors.
			ListVector::SetListSize(target, 0);
			ListVector::Append(target, source_child, source_child_size, source_entry.offset);

			auto &target_entry = tdata[target_offset];
			target_entry.length = source_entry.length;
			target_entry.offset = 0;
		} else {
			//! if the source has list offsets, we need to append them to the target
			//! build a selection vector for the copied child elements
			vector<sel_t> child_rows;
			for (idx_t i = 0; i < copy_count; ++i) {
				if (tmask.RowIsValid(target_offset + i)) {
					auto source_idx = sel->get_index(source_offset + i);
					auto &source_entry = sdata[source_idx];
					for (idx_t j = 0; j < source_entry.length; ++j) {
						child_rows.emplace_back(source_entry.offset + j);
					}
				}
			}
			idx_t source_child_size = child_rows.size();
			SelectionVector child_sel(child_rows.data());

			idx_t old_target_child_len = ListVector::GetListSize(target);

			//! append to list itself
			ListVector::Append(target, source_child, child_sel, source_child_size);

			//! now write the list offsets
			for (idx_t i = 0; i < copy_count; i++) {
				auto source_idx = sel->get_index(source_offset + i);
				auto &source_entry = sdata[source_idx];
				auto &target_entry = tdata[target_offset + i];

				target_entry.length = source_entry.length;
				target_entry.offset = old_target_child_len;
				if (tmask.RowIsValid(target_offset + i)) {
					old_target_child_len += target_entry.length;
				}
			}
		}
		break;
	}
	default:
		throw NotImplementedException("Unimplemented type '%s' for copy!",
		                              TypeIdToString(source->GetType().InternalType()));
	}

	if (target_vector_type != VectorType::FLAT_VECTOR) {
		target.SetVectorType(target_vector_type);
	}
}